

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

int __thiscall
mp::SOLReader2<mp::NLW2_SOLHandler_C_Impl>::sufheadcheck
          (SOLReader2<mp::NLW2_SOLHandler_C_Impl> *this,SufRead *sr)

{
  char *pcVar1;
  long in_RSI;
  long in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  int n;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((((*(int *)(in_RSI + 8) < 0) || (0xf < *(int *)(in_RSI + 8))) || (*(int *)(in_RSI + 0xc) < 0))
     || ((*(int *)(in_RSI + 0x10) < 2 || (*(int *)(in_RSI + 0x14) < 0)))) {
    iVar2 = 1;
  }
  else {
    *(uint *)(in_RDI + 0x410) = *(uint *)(in_RSI + 8) & 3;
    if ((*(int *)(in_RSI + 0x14) == 0) ||
       ((*(int *)(in_RSI + 0x48) <= *(int *)(in_RSI + 0x14) + 1 && (0 < *(int *)(in_RSI + 0x48)))))
    {
      std::vector<char,_std::allocator<char>_>::resize
                (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      pcVar1 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x125f38);
      *(char **)(in_RSI + 0x18) = pcVar1;
      *(long *)(in_RSI + 0x28) = *(long *)(in_RSI + 0x18) + (long)*(int *)(in_RSI + 0x10);
      *(long *)(in_RSI + 0x20) = *(long *)(in_RSI + 0x28) + (long)*(int *)(in_RSI + 0x14);
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int SOLReader2<SOLHandler>::sufheadcheck(SufRead* sr) {
  int n;

  n = (int)sr->h.n;
  if (sr->h.kind < 0 || sr->h.kind > 15 || n < 0 || sr->h.namelen < 2
   || sr->h.tablen < 0)
    return 1;
  i = (int)sr->h.kind & 3;
  if (sr->h.tablen
   && (sr->tablines > sr->h.tablen + 1 || sr->tablines < 1))
    return 1;
  sr->xp.resize((sr->h.tablen + 2*sr->h.namelen + 6));
  sr->name = (char*)sr->xp.data();
  sr->table = sr->name + sr->h.namelen;
  sr->tabname = sr->table + sr->h.tablen;
  return 0;
}